

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxReg_3D_C.H
# Opt level: O2

void amrex::fluxreg_fineareaadd
               (Box *bx,Array4<double> *reg,int rcomp,Array4<const_double> *area,
               Array4<const_double> *flx,int fcomp,int ncomp,int dir,Dim3 *ratio,Real mult)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  double *pdVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  bool bVar40;
  int local_c4;
  long local_c0;
  
  iVar22 = (bx->smallend).vect[0];
  lVar29 = (long)iVar22;
  iVar19 = (bx->smallend).vect[1];
  iVar1 = (bx->smallend).vect[2];
  lVar30 = (long)iVar19;
  lVar31 = (long)(bx->bigend).vect[0];
  lVar26 = (long)rcomp;
  local_c0 = (long)fcomp;
  uVar17 = 0;
  uVar21 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    uVar21 = uVar17;
  }
  iVar2 = (bx->bigend).vect[2];
  if (dir == 1) {
    iVar19 = iVar19 * ratio->y;
    local_c0 = local_c0 << 3;
    for (; uVar17 != uVar21; uVar17 = uVar17 + 1) {
      iVar22 = ratio->z;
      iVar14 = 0;
      if (0 < iVar22) {
        iVar14 = iVar22;
      }
      iVar18 = iVar1 * iVar22;
      for (iVar38 = iVar1; iVar38 <= iVar2; iVar38 = iVar38 + 1) {
        iVar13 = iVar18;
        for (iVar20 = 0; iVar20 != iVar14; iVar20 = iVar20 + 1) {
          uVar3 = ratio->x;
          uVar24 = 0;
          if (0 < (int)uVar3) {
            uVar24 = (ulong)uVar3;
          }
          lVar36 = lVar29 * 8 * (long)(int)uVar3;
          for (lVar23 = lVar29; lVar23 <= lVar31; lVar23 = lVar23 + 1) {
            iVar15 = (area->begin).y;
            lVar33 = lVar23 - (reg->begin).x;
            iVar4 = (area->begin).x;
            lVar37 = (lVar30 - (reg->begin).y) * reg->jstride;
            pdVar11 = reg->p;
            iVar5 = (area->begin).z;
            lVar35 = ((long)iVar38 - (long)(reg->begin).z) * reg->kstride;
            iVar6 = (flx->begin).y;
            lVar10 = area->kstride;
            lVar12 = area->jstride;
            iVar7 = (flx->begin).z;
            iVar8 = (flx->begin).x;
            lVar16 = flx->kstride;
            lVar25 = flx->jstride;
            lVar27 = flx->nstride;
            lVar39 = reg->nstride * (lVar26 + uVar17);
            pdVar32 = area->p;
            pdVar34 = flx->p;
            for (uVar28 = 0; uVar24 != uVar28; uVar28 = uVar28 + 1) {
              pdVar11[lVar37 + lVar33 + lVar35 + lVar39] =
                   *(double *)
                    ((long)pdVar32 +
                    uVar28 * 8 +
                    lVar36 + ((long)iVar13 - (long)iVar5) * lVar10 * 8 +
                    (iVar19 - iVar15) * lVar12 * 8 + (long)iVar4 * -8) * mult *
                   *(double *)
                    ((long)pdVar34 +
                    uVar28 * 8 +
                    lVar27 * local_c0 +
                    lVar36 + ((long)iVar13 - (long)iVar7) * lVar16 * 8 +
                    (iVar19 - iVar6) * lVar25 * 8 + (long)iVar8 * -8) +
                   pdVar11[lVar37 + lVar33 + lVar35 + lVar39];
            }
            lVar36 = lVar36 + (long)(int)uVar3 * 8;
          }
          iVar13 = iVar13 + 1;
        }
        iVar18 = iVar18 + iVar22;
      }
      local_c0 = local_c0 + 8;
    }
  }
  else {
    iVar14 = (bx->bigend).vect[1];
    if (dir == 0) {
      lVar31 = (long)(ratio->x * iVar22) * 8;
      local_c0 = local_c0 << 3;
      for (uVar17 = 0; uVar17 != uVar21; uVar17 = uVar17 + 1) {
        iVar22 = ratio->z;
        iVar19 = 0;
        if (0 < iVar22) {
          iVar19 = iVar22;
        }
        local_c4 = iVar1 * iVar22;
        for (iVar38 = iVar1; iVar38 <= iVar2; iVar38 = iVar38 + 1) {
          iVar18 = local_c4;
          for (iVar13 = 0; iVar13 != iVar19; iVar13 = iVar13 + 1) {
            uVar3 = ratio->y;
            uVar24 = 0;
            if (0 < (int)uVar3) {
              uVar24 = (ulong)uVar3;
            }
            lVar36 = lVar30 * (int)uVar3;
            for (lVar23 = lVar30; lVar23 <= iVar14; lVar23 = lVar23 + 1) {
              lVar10 = area->jstride;
              lVar25 = lVar29 - (reg->begin).x;
              lVar27 = (lVar23 - (reg->begin).y) * reg->jstride;
              pdVar11 = reg->p;
              lVar33 = ((long)iVar38 - (long)(reg->begin).z) * reg->kstride;
              pdVar32 = (double *)
                        ((long)area->p +
                        (lVar36 - (area->begin).y) * lVar10 * 8 +
                        ((long)iVar18 - (long)(area->begin).z) * area->kstride * 8 +
                        (long)(area->begin).x * -8 + lVar31);
              lVar12 = flx->jstride;
              lVar16 = reg->nstride * (lVar26 + uVar17);
              pdVar34 = (double *)
                        ((long)flx->p +
                        flx->nstride * local_c0 +
                        (lVar36 - (flx->begin).y) * lVar12 * 8 +
                        ((long)iVar18 - (long)(flx->begin).z) * flx->kstride * 8 +
                        (long)(flx->begin).x * -8 + lVar31);
              uVar28 = uVar24;
              while (bVar40 = uVar28 != 0, uVar28 = uVar28 - 1, bVar40) {
                pdVar11[lVar27 + lVar25 + lVar33 + lVar16] =
                     *pdVar32 * mult * *pdVar34 + pdVar11[lVar27 + lVar25 + lVar33 + lVar16];
                pdVar32 = pdVar32 + lVar10;
                pdVar34 = pdVar34 + lVar12;
              }
              lVar36 = lVar36 + (int)uVar3;
            }
            iVar18 = iVar18 + 1;
          }
          local_c4 = local_c4 + iVar22;
        }
        local_c0 = local_c0 + 8;
      }
    }
    else {
      iVar22 = ratio->z * iVar1;
      local_c0 = local_c0 << 3;
      for (uVar17 = 0; uVar17 != uVar21; uVar17 = uVar17 + 1) {
        iVar2 = ratio->y;
        iVar38 = 0;
        if (0 < iVar2) {
          iVar38 = iVar2;
        }
        iVar18 = iVar19 * iVar2;
        for (iVar13 = iVar19; iVar13 <= iVar14; iVar13 = iVar13 + 1) {
          iVar20 = iVar18;
          for (iVar15 = 0; iVar15 != iVar38; iVar15 = iVar15 + 1) {
            uVar3 = ratio->x;
            uVar24 = 0;
            if (0 < (int)uVar3) {
              uVar24 = (ulong)uVar3;
            }
            lVar23 = lVar29 * 8 * (long)(int)uVar3;
            for (lVar30 = lVar29; lVar30 <= lVar31; lVar30 = lVar30 + 1) {
              iVar4 = (area->begin).x;
              lVar37 = ((long)iVar13 - (long)(reg->begin).y) * reg->jstride;
              lVar27 = lVar30 - (reg->begin).x;
              iVar5 = (area->begin).y;
              pdVar11 = reg->p;
              iVar6 = (area->begin).z;
              lVar33 = ((long)iVar1 - (long)(reg->begin).z) * reg->kstride;
              lVar36 = area->jstride;
              iVar7 = (flx->begin).y;
              lVar10 = area->kstride;
              iVar8 = (flx->begin).z;
              iVar9 = (flx->begin).x;
              lVar12 = flx->jstride;
              lVar16 = flx->kstride;
              lVar25 = flx->nstride;
              lVar35 = reg->nstride * (lVar26 + uVar17);
              pdVar32 = area->p;
              pdVar34 = flx->p;
              for (uVar28 = 0; uVar24 != uVar28; uVar28 = uVar28 + 1) {
                pdVar11[lVar37 + lVar27 + lVar33 + lVar35] =
                     *(double *)
                      ((long)pdVar32 +
                      uVar28 * 8 +
                      lVar23 + ((long)iVar20 - (long)iVar5) * lVar36 * 8 +
                      (iVar22 - iVar6) * lVar10 * 8 + (long)iVar4 * -8) * mult *
                     *(double *)
                      ((long)pdVar34 +
                      uVar28 * 8 +
                      lVar25 * local_c0 +
                      lVar23 + ((long)iVar20 - (long)iVar7) * lVar12 * 8 +
                      (iVar22 - iVar8) * lVar16 * 8 + (long)iVar9 * -8) +
                     pdVar11[lVar37 + lVar27 + lVar33 + lVar35];
              }
              lVar23 = lVar23 + (long)(int)uVar3 * 8;
            }
            iVar20 = iVar20 + 1;
          }
          iVar18 = iVar18 + iVar2;
        }
        local_c0 = local_c0 + 8;
      }
    }
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE inline void
fluxreg_fineareaadd (Box const& bx, Array4<Real> const& reg, const int rcomp,
                     Array4<Real const> const& area,
                     Array4<Real const> const& flx, const int fcomp, const int ncomp,
                     const int dir, Dim3 const& ratio, const Real mult) noexcept
{
    const auto lo  = amrex::lbound(bx);
    const auto hi  = amrex::ubound(bx);

    switch (dir) {
    case 0:
    {
        const int ic = lo.x;
        const int i = ic*ratio.x;
        for (int n = 0; n < ncomp; ++n) {
            for (int kc = lo.z; kc <= hi.z; ++kc) {
                for (int koff = 0; koff < ratio.z; ++koff) {
                    const int k = ratio.z*kc + koff;
                    for (int jc = lo.y; jc <= hi.y; ++jc) {
                        for (int joff = 0; joff < ratio.y; ++joff) {
                            const int j = ratio.y*jc + joff;
                            reg(ic,jc,kc,n+rcomp) += mult*area(i,j,k)
                                                         * flx(i,j,k,n+fcomp);
                        }
                    }
                }
            }
        }
        break;
    }
    case 1:
    {
        const int jc = lo.y;
        const int j = jc*ratio.y;
        for (int n = 0; n < ncomp; ++n) {
            for (int kc = lo.z; kc <= hi.z; ++kc) {
                for (int koff = 0; koff < ratio.z; ++koff) {
                    const int k = ratio.z*kc + koff;
                    for (int ic = lo.x; ic <= hi.x; ++ic) {
                        for (int ioff = 0; ioff < ratio.x; ++ioff) {
                            const int i = ratio.x*ic + ioff;
                            reg(ic,jc,kc,n+rcomp) += mult*area(i,j,k)
                                                         * flx(i,j,k,n+fcomp);
                        }
                    }
                }
            }
        }
        break;
    }
    default:
    {
        const int kc = lo.z;
        const int k = kc*ratio.z;
        for (int n = 0; n < ncomp; ++n) {
            for (int jc = lo.y; jc <= hi.y; ++jc) {
                for (int joff = 0; joff < ratio.y; ++joff) {
                    const int j = ratio.y*jc + joff;
                    for (int ic = lo.x; ic <= hi.x; ++ic) {
                        for (int ioff = 0; ioff < ratio.x; ++ioff) {
                            const int i = ratio.x*ic + ioff;
                            reg(ic,jc,kc,n+rcomp) += mult*area(i,j,k)
                                                         * flx(i,j,k,n+fcomp);
                        }
                    }
                }
            }
        }
    }
    }
}